

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O3

void test_bson_json_read_raw_utf8(void)

{
  char cVar1;
  int iVar2;
  long lVar3;
  char *pcVar4;
  undefined8 uVar5;
  long unaff_RBX;
  int *__haystack;
  bson_iter_t iter;
  undefined1 auStack_320 [16];
  code *pcStack_310;
  int iStack_308;
  int iStack_304;
  char acStack_300 [504];
  code *pcStack_108;
  undefined1 auStack_100 [232];
  
  pcStack_108 = (code *)0x130c56;
  lVar3 = bson_new_from_json(anon_var_dwarf_1a4c2,0xffffffffffffffff,0);
  if (lVar3 == 0) {
    pcStack_108 = (code *)0x130cf1;
    test_bson_json_read_raw_utf8_cold_5();
LAB_00130cf1:
    pcStack_108 = (code *)0x130cf6;
    test_bson_json_read_raw_utf8_cold_1();
    lVar3 = unaff_RBX;
LAB_00130cf6:
    pcStack_108 = (code *)0x130cfb;
    test_bson_json_read_raw_utf8_cold_4();
LAB_00130cfb:
    pcStack_108 = (code *)0x130d03;
    test_bson_json_read_raw_utf8_cold_2();
  }
  else {
    pcStack_108 = (code *)0x130c77;
    cVar1 = bson_iter_init_find(auStack_100,lVar3,anon_var_dwarf_48e4 + 0xc);
    unaff_RBX = lVar3;
    if (cVar1 == '\0') goto LAB_00130cf1;
    pcStack_108 = (code *)0x130c83;
    pcVar4 = (char *)bson_iter_key(auStack_100);
    if (pcVar4 != anon_var_dwarf_48e4 + 0xc) {
      pcStack_108 = (code *)0x130c90;
      pcVar4 = (char *)bson_iter_key(auStack_100);
      pcStack_108 = (code *)0x130c9f;
      iVar2 = strcmp(pcVar4,anon_var_dwarf_48e4 + 0xc);
      if (iVar2 == 0) goto LAB_00130ca3;
      goto LAB_00130cfb;
    }
LAB_00130ca3:
    pcStack_108 = (code *)0x130cad;
    pcVar4 = (char *)bson_iter_utf8(auStack_100);
    if (pcVar4 == anon_var_dwarf_48e4 + 0xc) {
LAB_00130ccf:
      pcStack_108 = (code *)0x130cd7;
      cVar1 = bson_iter_next(auStack_100);
      if (cVar1 == '\0') {
        pcStack_108 = (code *)0x130ce3;
        bson_destroy(lVar3);
        return;
      }
      goto LAB_00130cf6;
    }
    pcStack_108 = (code *)0x130cbc;
    pcVar4 = (char *)bson_iter_utf8(auStack_100,0);
    pcStack_108 = (code *)0x130ccb;
    iVar2 = strcmp(pcVar4,anon_var_dwarf_48e4 + 0xc);
    if (iVar2 == 0) goto LAB_00130ccf;
  }
  pcStack_108 = test_bson_json_read_corrupt_utf8;
  test_bson_json_read_raw_utf8_cold_3();
  __haystack = &iStack_308;
  pcStack_310 = (code *)0x130d25;
  pcStack_108 = (code *)lVar3;
  memset(&iStack_308,0,0x200);
  pcStack_310 = (code *)0x130d3b;
  lVar3 = bson_new_from_json(anon_var_dwarf_1a50a,0xffffffffffffffff,&iStack_308);
  if (lVar3 == 0) {
    __haystack = &iStack_308;
    if (iStack_308 != 1) goto LAB_00130dbd;
    __haystack = &iStack_308;
    if (iStack_304 != 1) goto LAB_00130dc2;
    __haystack = (int *)acStack_300;
    pcStack_310 = (code *)0x130d65;
    pcVar4 = strstr((char *)__haystack,"invalid bytes in UTF8 string");
    if (pcVar4 == (char *)0x0) goto LAB_00130dc7;
    pcStack_310 = (code *)0x130d80;
    lVar3 = bson_new_from_json(anon_var_dwarf_1a516,0xffffffffffffffff,&iStack_308);
    if (lVar3 != 0) goto LAB_00130db8;
    if (iStack_308 != 1) goto LAB_00130dcf;
    if (iStack_304 == 1) {
      pcStack_310 = (code *)0x130da5;
      pcVar4 = strstr((char *)__haystack,"invalid bytes in UTF8 string");
      if (pcVar4 != (char *)0x0) {
        return;
      }
      goto LAB_00130dd9;
    }
  }
  else {
    pcStack_310 = (code *)0x130db8;
    test_bson_json_read_corrupt_utf8_cold_1();
LAB_00130db8:
    pcStack_310 = (code *)0x130dbd;
    test_bson_json_read_corrupt_utf8_cold_4();
LAB_00130dbd:
    pcStack_310 = (code *)0x130dc2;
    test_bson_json_read_corrupt_utf8_cold_2();
LAB_00130dc2:
    pcStack_310 = (code *)0x130dc7;
    test_bson_json_read_corrupt_utf8_cold_3();
LAB_00130dc7:
    pcStack_310 = (code *)0x130dcf;
    test_bson_json_read_corrupt_utf8_cold_8();
LAB_00130dcf:
    pcStack_310 = (code *)0x130dd4;
    test_bson_json_read_corrupt_utf8_cold_5();
  }
  pcStack_310 = (code *)0x130dd9;
  test_bson_json_read_corrupt_utf8_cold_6();
LAB_00130dd9:
  pcStack_310 = test_bson_json_read_decimal128;
  test_bson_json_read_corrupt_utf8_cold_7();
  pcStack_310 = (code *)__haystack;
  bson_decimal128_from_string("123.5",auStack_320);
  uVar5 = bson_bcon_magic();
  iVar2 = 0x14ca78;
  uVar5 = bcon_new(0,"decimal",uVar5,0x12,auStack_320,0);
  _test_bson_json_read_compare("{ \"decimal\" : { \"$numberDecimal\" : \"123.5\" }}",iVar2,uVar5,0);
  return;
}

Assistant:

static void
test_bson_json_read_raw_utf8 (void)
{
   bson_t *bson;
   bson_iter_t iter;

   bson = bson_new_from_json (
      (const uint8_t *) "{\"" EU "\": \"" EU "\"}", -1, NULL);
   ASSERT (bson);
   ASSERT (bson_iter_init_find (&iter, bson, EU));
   ASSERT_CMPSTR (bson_iter_key (&iter), EU);
   ASSERT_CMPSTR (bson_iter_utf8 (&iter, NULL), EU);
   ASSERT (!bson_iter_next (&iter));

   bson_destroy (bson);
}